

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableMapFieldLiteGenerator::GenerateInterfaceMembers
          (ImmutableMapFieldLiteGenerator *this,Printer *printer)

{
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *vars;
  Context *pCVar1;
  pointer pcVar2;
  FieldDescriptor *pFVar3;
  bool bVar4;
  JavaType JVar5;
  FieldDescriptor *pFVar6;
  MessageLite *pMVar7;
  EnumDescriptor *pEVar8;
  char *pcVar9;
  size_t sVar10;
  string_view begin_varname;
  string_view begin_varname_00;
  string_view begin_varname_01;
  string_view begin_varname_02;
  string_view begin_varname_03;
  string_view begin_varname_04;
  string_view begin_varname_05;
  string_view begin_varname_06;
  string_view begin_varname_07;
  string_view begin_varname_08;
  string_view begin_varname_09;
  string_view begin_varname_10;
  string_view begin_varname_11;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view text_06;
  string_view text_07;
  string_view text_08;
  string_view text_09;
  string_view text_10;
  string_view text_11;
  string_view end_varname;
  string_view end_varname_00;
  string_view end_varname_01;
  string_view end_varname_02;
  string_view end_varname_03;
  string_view end_varname_04;
  string_view end_varname_05;
  string_view end_varname_06;
  string_view end_varname_07;
  string_view end_varname_08;
  string_view end_varname_09;
  string_view end_varname_10;
  string_view end_varname_11;
  undefined1 local_3a0 [8];
  _Alloc_hider local_398;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  _Alloc_hider local_378;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  undefined2 local_358;
  undefined1 local_350 [8];
  _Alloc_hider local_348;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338;
  _Alloc_hider local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  undefined2 local_308;
  undefined1 local_300 [8];
  _Alloc_hider local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  _Alloc_hider local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  undefined2 local_2b8;
  undefined1 local_2b0 [8];
  _Alloc_hider local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  _Alloc_hider local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  undefined2 local_268;
  undefined1 local_260 [8];
  _Alloc_hider local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  _Alloc_hider local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  undefined2 local_218;
  undefined1 local_210 [8];
  _Alloc_hider local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  _Alloc_hider local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  undefined2 local_1c8;
  undefined1 local_1c0 [8];
  _Alloc_hider local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  _Alloc_hider local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  undefined2 local_178;
  undefined1 local_170 [8];
  _Alloc_hider local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  _Alloc_hider local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  undefined2 local_128;
  undefined1 local_120 [8];
  _Alloc_hider local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  _Alloc_hider local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  undefined2 local_d8;
  undefined1 local_d0 [8];
  _Alloc_hider local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  _Alloc_hider local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  undefined2 local_88;
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined2 local_38;
  
  pFVar6 = this->descriptor_;
  pCVar1 = this->context_;
  local_80[4] = (pCVar1->options_).opensource_runtime;
  local_80[5] = (pCVar1->options_).annotate_code;
  local_80[0] = (pCVar1->options_).generate_immutable_code;
  local_80[1] = (pCVar1->options_).generate_mutable_code;
  local_80[2] = (pCVar1->options_).generate_shared_code;
  local_80[3] = (pCVar1->options_).enforce_lite;
  pcVar2 = (pCVar1->options_).annotation_list_file._M_dataplus._M_p;
  local_78._M_p = (pointer)&local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar2,
             pcVar2 + (pCVar1->options_).annotation_list_file._M_string_length);
  pcVar2 = (pCVar1->options_).output_list_file._M_dataplus._M_p;
  local_58._M_p = (pointer)&local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,
             pcVar2 + (pCVar1->options_).output_list_file._M_string_length);
  local_38._0_1_ = (pCVar1->options_).strip_nonfunctional_codegen;
  local_38._1_1_ = (pCVar1->options_).jvm_dsl;
  WriteFieldDocComment(printer,pFVar6,(Options *)local_80,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_p != &local_48) {
    operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_p != &local_68) {
    operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
  }
  vars = &this->variables_;
  text._M_str = "$deprecation$int ${$get$capitalized_name$Count$}$();\n";
  text._M_len = 0x35;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text);
  begin_varname._M_str = "{";
  begin_varname._M_len = 1;
  end_varname._M_str = "}";
  end_varname._M_len = 1;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,begin_varname,end_varname,this->descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
  pFVar6 = this->descriptor_;
  pCVar1 = this->context_;
  local_d0[4] = (pCVar1->options_).opensource_runtime;
  local_d0[5] = (pCVar1->options_).annotate_code;
  local_d0[0] = (pCVar1->options_).generate_immutable_code;
  local_d0[1] = (pCVar1->options_).generate_mutable_code;
  local_d0[2] = (pCVar1->options_).generate_shared_code;
  local_d0[3] = (pCVar1->options_).enforce_lite;
  pcVar2 = (pCVar1->options_).annotation_list_file._M_dataplus._M_p;
  local_c8._M_p = (pointer)&local_b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,pcVar2,
             pcVar2 + (pCVar1->options_).annotation_list_file._M_string_length);
  pcVar2 = (pCVar1->options_).output_list_file._M_dataplus._M_p;
  local_a8._M_p = (pointer)&local_98;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar2,
             pcVar2 + (pCVar1->options_).output_list_file._M_string_length);
  local_88._0_1_ = (pCVar1->options_).strip_nonfunctional_codegen;
  local_88._1_1_ = (pCVar1->options_).jvm_dsl;
  WriteFieldDocComment(printer,pFVar6,(Options *)local_d0,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_p != &local_98) {
    operator_delete(local_a8._M_p,local_98._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_p != &local_b8) {
    operator_delete(local_c8._M_p,local_b8._M_allocated_capacity + 1);
  }
  text_00._M_str = "$deprecation$boolean ${$contains$capitalized_name$$}$(\n    $key_type$ key);\n";
  text_00._M_len = 0x4c;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_00);
  begin_varname_00._M_str = "{";
  begin_varname_00._M_len = 1;
  end_varname_00._M_str = "}";
  end_varname_00._M_len = 1;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,begin_varname_00,end_varname_00,this->descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
  pFVar6 = MapValueField(this->descriptor_);
  JVar5 = GetJavaType(pFVar6);
  bVar4 = (this->context_->options_).opensource_runtime;
  if (JVar5 == JAVATYPE_ENUM) {
    if (bVar4 != false) {
      text_01._M_str =
           "/**\n * Use {@link #get$capitalized_name$Map()} instead.\n */\n@java.lang.Deprecated\njava.util.Map<$boxed_key_type$, $value_enum_type$>\n${$get$capitalized_name$$}$();\n"
      ;
      text_01._M_len = 0xa4;
      io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (printer,vars,text_01);
      begin_varname_01._M_str = "{";
      begin_varname_01._M_len = 1;
      end_varname_01._M_str = "}";
      end_varname_01._M_len = 1;
      io::Printer::Annotate<google::protobuf::FieldDescriptor>
                (printer,begin_varname_01,end_varname_01,this->descriptor_,
                 (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    }
    pFVar3 = this->descriptor_;
    pCVar1 = this->context_;
    local_120[4] = (pCVar1->options_).opensource_runtime;
    local_120[5] = (pCVar1->options_).annotate_code;
    local_120[0] = (pCVar1->options_).generate_immutable_code;
    local_120[1] = (pCVar1->options_).generate_mutable_code;
    local_120[2] = (pCVar1->options_).generate_shared_code;
    local_120[3] = (pCVar1->options_).enforce_lite;
    pcVar2 = (pCVar1->options_).annotation_list_file._M_dataplus._M_p;
    local_118._M_p = (pointer)&local_108;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_118,pcVar2,
               pcVar2 + (pCVar1->options_).annotation_list_file._M_string_length);
    pcVar2 = (pCVar1->options_).output_list_file._M_dataplus._M_p;
    local_f8._M_p = (pointer)&local_e8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,pcVar2,
               pcVar2 + (pCVar1->options_).output_list_file._M_string_length);
    local_d8._0_1_ = (pCVar1->options_).strip_nonfunctional_codegen;
    local_d8._1_1_ = (pCVar1->options_).jvm_dsl;
    WriteFieldDocComment(printer,pFVar3,(Options *)local_120,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_p != &local_e8) {
      operator_delete(local_f8._M_p,local_e8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_p != &local_108) {
      operator_delete(local_118._M_p,local_108._M_allocated_capacity + 1);
    }
    text_02._M_str =
         "$deprecation$java.util.Map<$boxed_key_type$, $value_enum_type$>\n${$get$capitalized_name$Map$}$();\n"
    ;
    text_02._M_len = 0x62;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,vars,text_02);
    begin_varname_02._M_str = "{";
    begin_varname_02._M_len = 1;
    end_varname_02._M_str = "}";
    end_varname_02._M_len = 1;
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (printer,begin_varname_02,end_varname_02,this->descriptor_,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    pFVar3 = this->descriptor_;
    pCVar1 = this->context_;
    local_170[4] = (pCVar1->options_).opensource_runtime;
    local_170[5] = (pCVar1->options_).annotate_code;
    local_170[0] = (pCVar1->options_).generate_immutable_code;
    local_170[1] = (pCVar1->options_).generate_mutable_code;
    local_170[2] = (pCVar1->options_).generate_shared_code;
    local_170[3] = (pCVar1->options_).enforce_lite;
    pcVar2 = (pCVar1->options_).annotation_list_file._M_dataplus._M_p;
    local_168._M_p = (pointer)&local_158;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_168,pcVar2,
               pcVar2 + (pCVar1->options_).annotation_list_file._M_string_length);
    pcVar2 = (pCVar1->options_).output_list_file._M_dataplus._M_p;
    local_148._M_p = (pointer)&local_138;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_148,pcVar2,
               pcVar2 + (pCVar1->options_).output_list_file._M_string_length);
    local_128._0_1_ = (pCVar1->options_).strip_nonfunctional_codegen;
    local_128._1_1_ = (pCVar1->options_).jvm_dsl;
    WriteFieldDocComment(printer,pFVar3,(Options *)local_170,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_p != &local_138) {
      operator_delete(local_148._M_p,local_138._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_p != &local_158) {
      operator_delete(local_168._M_p,local_158._M_allocated_capacity + 1);
    }
    text_03._M_str =
         "$deprecation$$value_enum_type_pass_through_nullness$ ${$get$capitalized_name$OrDefault$}$(\n    $key_type$ key,\n    $value_enum_type_pass_through_nullness$         defaultValue);\n"
    ;
    text_03._M_len = 0xb2;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,vars,text_03);
    begin_varname_03._M_str = "{";
    begin_varname_03._M_len = 1;
    end_varname_03._M_str = "}";
    end_varname_03._M_len = 1;
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (printer,begin_varname_03,end_varname_03,this->descriptor_,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    pFVar3 = this->descriptor_;
    pCVar1 = this->context_;
    local_1c0[4] = (pCVar1->options_).opensource_runtime;
    local_1c0[5] = (pCVar1->options_).annotate_code;
    local_1c0[0] = (pCVar1->options_).generate_immutable_code;
    local_1c0[1] = (pCVar1->options_).generate_mutable_code;
    local_1c0[2] = (pCVar1->options_).generate_shared_code;
    local_1c0[3] = (pCVar1->options_).enforce_lite;
    pcVar2 = (pCVar1->options_).annotation_list_file._M_dataplus._M_p;
    local_1b8._M_p = (pointer)&local_1a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b8,pcVar2,
               pcVar2 + (pCVar1->options_).annotation_list_file._M_string_length);
    pcVar2 = (pCVar1->options_).output_list_file._M_dataplus._M_p;
    local_198._M_p = (pointer)&local_188;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_198,pcVar2,
               pcVar2 + (pCVar1->options_).output_list_file._M_string_length);
    local_178._0_1_ = (pCVar1->options_).strip_nonfunctional_codegen;
    local_178._1_1_ = (pCVar1->options_).jvm_dsl;
    WriteFieldDocComment(printer,pFVar3,(Options *)local_1c0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_p != &local_188) {
      operator_delete(local_198._M_p,local_188._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_p != &local_1a8) {
      operator_delete(local_1b8._M_p,local_1a8._M_allocated_capacity + 1);
    }
    text_04._M_str =
         "$deprecation$$value_enum_type$ ${$get$capitalized_name$OrThrow$}$(\n    $key_type$ key);\n"
    ;
    text_04._M_len = 0x58;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,vars,text_04);
    begin_varname_04._M_str = "{";
    begin_varname_04._M_len = 1;
    end_varname_04._M_str = "}";
    end_varname_04._M_len = 1;
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (printer,begin_varname_04,end_varname_04,this->descriptor_,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    pMVar7 = protobuf::internal::ExtensionSet::GetMessage
                       (&(pFVar6->merged_features_->field_0)._impl_._extensions_,pb::java,
                        (MessageLite *)PTR__JavaFeatures_default_instance__00855a30);
    if (*(char *)((long)&pMVar7[1]._internal_metadata_.ptr_ + 4) != '\0') {
      return;
    }
    pEVar8 = FieldDescriptor::enum_type(pFVar6);
    if (pEVar8 == (EnumDescriptor *)0x0) {
      return;
    }
    pEVar8 = FieldDescriptor::enum_type(pFVar6);
    bVar4 = EnumDescriptor::is_closed(pEVar8);
    if (bVar4) {
      return;
    }
    text_05._M_str =
         "/**\n * Use {@link #get$capitalized_name$ValueMap()} instead.\n */\n@java.lang.Deprecated\njava.util.Map<$type_parameters$>\n${$get$capitalized_name$Value$}$();\n"
    ;
    text_05._M_len = 0x9c;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,vars,text_05);
    begin_varname_05._M_str = "{";
    begin_varname_05._M_len = 1;
    end_varname_05._M_str = "}";
    end_varname_05._M_len = 1;
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (printer,begin_varname_05,end_varname_05,this->descriptor_,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    pFVar6 = this->descriptor_;
    pCVar1 = this->context_;
    local_210[4] = (pCVar1->options_).opensource_runtime;
    local_210[5] = (pCVar1->options_).annotate_code;
    local_210[0] = (pCVar1->options_).generate_immutable_code;
    local_210[1] = (pCVar1->options_).generate_mutable_code;
    local_210[2] = (pCVar1->options_).generate_shared_code;
    local_210[3] = (pCVar1->options_).enforce_lite;
    pcVar2 = (pCVar1->options_).annotation_list_file._M_dataplus._M_p;
    local_208._M_p = (pointer)&local_1f8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_208,pcVar2,
               pcVar2 + (pCVar1->options_).annotation_list_file._M_string_length);
    pcVar2 = (pCVar1->options_).output_list_file._M_dataplus._M_p;
    local_1e8._M_p = (pointer)&local_1d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1e8,pcVar2,
               pcVar2 + (pCVar1->options_).output_list_file._M_string_length);
    local_1c8._0_1_ = (pCVar1->options_).strip_nonfunctional_codegen;
    local_1c8._1_1_ = (pCVar1->options_).jvm_dsl;
    WriteFieldDocComment(printer,pFVar6,(Options *)local_210,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_p != &local_1d8) {
      operator_delete(local_1e8._M_p,local_1d8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_p != &local_1f8) {
      operator_delete(local_208._M_p,local_1f8._M_allocated_capacity + 1);
    }
    text_06._M_str =
         "$deprecation$java.util.Map<$type_parameters$>\n${$get$capitalized_name$ValueMap$}$();\n";
    text_06._M_len = 0x55;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,vars,text_06);
    begin_varname_06._M_str = "{";
    begin_varname_06._M_len = 1;
    end_varname_06._M_str = "}";
    end_varname_06._M_len = 1;
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (printer,begin_varname_06,end_varname_06,this->descriptor_,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    pFVar6 = this->descriptor_;
    pCVar1 = this->context_;
    local_260[4] = (pCVar1->options_).opensource_runtime;
    local_260[5] = (pCVar1->options_).annotate_code;
    local_260[0] = (pCVar1->options_).generate_immutable_code;
    local_260[1] = (pCVar1->options_).generate_mutable_code;
    local_260[2] = (pCVar1->options_).generate_shared_code;
    local_260[3] = (pCVar1->options_).enforce_lite;
    pcVar2 = (pCVar1->options_).annotation_list_file._M_dataplus._M_p;
    local_258._M_p = (pointer)&local_248;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_258,pcVar2,
               pcVar2 + (pCVar1->options_).annotation_list_file._M_string_length);
    pcVar2 = (pCVar1->options_).output_list_file._M_dataplus._M_p;
    local_238._M_p = (pointer)&local_228;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_238,pcVar2,
               pcVar2 + (pCVar1->options_).output_list_file._M_string_length);
    local_218._0_1_ = (pCVar1->options_).strip_nonfunctional_codegen;
    local_218._1_1_ = (pCVar1->options_).jvm_dsl;
    WriteFieldDocComment(printer,pFVar6,(Options *)local_260,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_p != &local_228) {
      operator_delete(local_238._M_p,local_228._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_p != &local_248) {
      operator_delete(local_258._M_p,local_248._M_allocated_capacity + 1);
    }
    text_07._M_str =
         "$deprecation$\n$value_type_pass_through_nullness$ ${$get$capitalized_name$ValueOrDefault$}$(\n    $key_type$ key,\n    $value_type_pass_through_nullness$ defaultValue);\n"
    ;
    text_07._M_len = 0xa6;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,vars,text_07);
    begin_varname_07._M_str = "{";
    begin_varname_07._M_len = 1;
    end_varname_07._M_str = "}";
    end_varname_07._M_len = 1;
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (printer,begin_varname_07,end_varname_07,this->descriptor_,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    pFVar6 = this->descriptor_;
    pCVar1 = this->context_;
    local_2b0[4] = (pCVar1->options_).opensource_runtime;
    local_2b0[5] = (pCVar1->options_).annotate_code;
    local_2b0[0] = (pCVar1->options_).generate_immutable_code;
    local_2b0[1] = (pCVar1->options_).generate_mutable_code;
    local_2b0[2] = (pCVar1->options_).generate_shared_code;
    local_2b0[3] = (pCVar1->options_).enforce_lite;
    pcVar2 = (pCVar1->options_).annotation_list_file._M_dataplus._M_p;
    local_2a8._M_p = (pointer)&local_298;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2a8,pcVar2,
               pcVar2 + (pCVar1->options_).annotation_list_file._M_string_length);
    pcVar2 = (pCVar1->options_).output_list_file._M_dataplus._M_p;
    local_288._M_p = (pointer)&local_278;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_288,pcVar2,
               pcVar2 + (pCVar1->options_).output_list_file._M_string_length);
    local_268._0_1_ = (pCVar1->options_).strip_nonfunctional_codegen;
    local_268._1_1_ = (pCVar1->options_).jvm_dsl;
    WriteFieldDocComment(printer,pFVar6,(Options *)local_2b0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_p != &local_278) {
      operator_delete(local_288._M_p,local_278._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_p != &local_298) {
      operator_delete(local_2a8._M_p,local_298._M_allocated_capacity + 1);
    }
    pcVar9 = 
    "$deprecation$\n$value_type$ ${$get$capitalized_name$ValueOrThrow$}$(\n    $key_type$ key);\n";
    sVar10 = 0x59;
  }
  else {
    if (bVar4 != false) {
      text_08._M_str =
           "/**\n * Use {@link #get$capitalized_name$Map()} instead.\n */\n@java.lang.Deprecated\njava.util.Map<$type_parameters$>\n${$get$capitalized_name$$}$();\n"
      ;
      text_08._M_len = 0x92;
      io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (printer,vars,text_08);
      begin_varname_08._M_str = "{";
      begin_varname_08._M_len = 1;
      end_varname_08._M_str = "}";
      end_varname_08._M_len = 1;
      io::Printer::Annotate<google::protobuf::FieldDescriptor>
                (printer,begin_varname_08,end_varname_08,this->descriptor_,
                 (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    }
    pFVar6 = this->descriptor_;
    pCVar1 = this->context_;
    local_300[4] = (pCVar1->options_).opensource_runtime;
    local_300[5] = (pCVar1->options_).annotate_code;
    local_300[0] = (pCVar1->options_).generate_immutable_code;
    local_300[1] = (pCVar1->options_).generate_mutable_code;
    local_300[2] = (pCVar1->options_).generate_shared_code;
    local_300[3] = (pCVar1->options_).enforce_lite;
    pcVar2 = (pCVar1->options_).annotation_list_file._M_dataplus._M_p;
    local_2f8._M_p = (pointer)&local_2e8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2f8,pcVar2,
               pcVar2 + (pCVar1->options_).annotation_list_file._M_string_length);
    pcVar2 = (pCVar1->options_).output_list_file._M_dataplus._M_p;
    local_2d8._M_p = (pointer)&local_2c8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2d8,pcVar2,
               pcVar2 + (pCVar1->options_).output_list_file._M_string_length);
    local_2b8._0_1_ = (pCVar1->options_).strip_nonfunctional_codegen;
    local_2b8._1_1_ = (pCVar1->options_).jvm_dsl;
    WriteFieldDocComment(printer,pFVar6,(Options *)local_300,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_p != &local_2c8) {
      operator_delete(local_2d8._M_p,local_2c8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_p != &local_2e8) {
      operator_delete(local_2f8._M_p,local_2e8._M_allocated_capacity + 1);
    }
    text_09._M_str =
         "$deprecation$java.util.Map<$type_parameters$>\n${$get$capitalized_name$Map$}$();\n";
    text_09._M_len = 0x50;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,vars,text_09);
    begin_varname_09._M_str = "{";
    begin_varname_09._M_len = 1;
    end_varname_09._M_str = "}";
    end_varname_09._M_len = 1;
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (printer,begin_varname_09,end_varname_09,this->descriptor_,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    pFVar6 = this->descriptor_;
    pCVar1 = this->context_;
    local_350[4] = (pCVar1->options_).opensource_runtime;
    local_350[5] = (pCVar1->options_).annotate_code;
    local_350[0] = (pCVar1->options_).generate_immutable_code;
    local_350[1] = (pCVar1->options_).generate_mutable_code;
    local_350[2] = (pCVar1->options_).generate_shared_code;
    local_350[3] = (pCVar1->options_).enforce_lite;
    pcVar2 = (pCVar1->options_).annotation_list_file._M_dataplus._M_p;
    local_348._M_p = (pointer)&local_338;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_348,pcVar2,
               pcVar2 + (pCVar1->options_).annotation_list_file._M_string_length);
    pcVar2 = (pCVar1->options_).output_list_file._M_dataplus._M_p;
    local_328._M_p = (pointer)&local_318;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_328,pcVar2,
               pcVar2 + (pCVar1->options_).output_list_file._M_string_length);
    local_308._0_1_ = (pCVar1->options_).strip_nonfunctional_codegen;
    local_308._1_1_ = (pCVar1->options_).jvm_dsl;
    WriteFieldDocComment(printer,pFVar6,(Options *)local_350,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_p != &local_318) {
      operator_delete(local_328._M_p,local_318._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_p != &local_338) {
      operator_delete(local_348._M_p,local_338._M_allocated_capacity + 1);
    }
    text_10._M_str =
         "$deprecation$\n$value_type_pass_through_nullness$ ${$get$capitalized_name$OrDefault$}$(\n    $key_type$ key,\n    $value_type_pass_through_nullness$ defaultValue);\n"
    ;
    text_10._M_len = 0xa1;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,vars,text_10);
    begin_varname_10._M_str = "{";
    begin_varname_10._M_len = 1;
    end_varname_10._M_str = "}";
    end_varname_10._M_len = 1;
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (printer,begin_varname_10,end_varname_10,this->descriptor_,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    pFVar6 = this->descriptor_;
    pCVar1 = this->context_;
    local_3a0[4] = (pCVar1->options_).opensource_runtime;
    local_3a0[5] = (pCVar1->options_).annotate_code;
    local_3a0[0] = (pCVar1->options_).generate_immutable_code;
    local_3a0[1] = (pCVar1->options_).generate_mutable_code;
    local_3a0[2] = (pCVar1->options_).generate_shared_code;
    local_3a0[3] = (pCVar1->options_).enforce_lite;
    pcVar2 = (pCVar1->options_).annotation_list_file._M_dataplus._M_p;
    local_398._M_p = (pointer)&local_388;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_398,pcVar2,
               pcVar2 + (pCVar1->options_).annotation_list_file._M_string_length);
    pcVar2 = (pCVar1->options_).output_list_file._M_dataplus._M_p;
    local_378._M_p = (pointer)&local_368;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_378,pcVar2,
               pcVar2 + (pCVar1->options_).output_list_file._M_string_length);
    local_358._0_1_ = (pCVar1->options_).strip_nonfunctional_codegen;
    local_358._1_1_ = (pCVar1->options_).jvm_dsl;
    WriteFieldDocComment(printer,pFVar6,(Options *)local_3a0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_p != &local_368) {
      operator_delete(local_378._M_p,local_368._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_p != &local_388) {
      operator_delete(local_398._M_p,local_388._M_allocated_capacity + 1);
    }
    pcVar9 = 
    "$deprecation$\n$value_type$ ${$get$capitalized_name$OrThrow$}$(\n    $key_type$ key);\n";
    sVar10 = 0x54;
  }
  text_11._M_str = pcVar9;
  text_11._M_len = sVar10;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_11);
  begin_varname_11._M_str = "{";
  begin_varname_11._M_len = 1;
  end_varname_11._M_str = "}";
  end_varname_11._M_len = 1;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,begin_varname_11,end_varname_11,this->descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
  return;
}

Assistant:

void ImmutableMapFieldLiteGenerator::GenerateInterfaceMembers(
    io::Printer* printer) const {
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(variables_,
                 "$deprecation$int ${$get$capitalized_name$Count$}$();\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(variables_,
                 "$deprecation$boolean ${$contains$capitalized_name$$}$(\n"
                 "    $key_type$ key);\n");
  printer->Annotate("{", "}", descriptor_);
  const FieldDescriptor* value = MapValueField(descriptor_);
  if (GetJavaType(value) == JAVATYPE_ENUM) {
    if (context_->options().opensource_runtime) {
      printer->Print(variables_,
                     "/**\n"
                     " * Use {@link #get$capitalized_name$Map()} instead.\n"
                     " */\n"
                     "@java.lang.Deprecated\n"
                     "java.util.Map<$boxed_key_type$, $value_enum_type$>\n"
                     "${$get$capitalized_name$$}$();\n");
      printer->Annotate("{", "}", descriptor_);
    }
    WriteFieldDocComment(printer, descriptor_, context_->options());
    printer->Print(
        variables_,
        "$deprecation$java.util.Map<$boxed_key_type$, $value_enum_type$>\n"
        "${$get$capitalized_name$Map$}$();\n");
    printer->Annotate("{", "}", descriptor_);
    WriteFieldDocComment(printer, descriptor_, context_->options());
    printer->Print(variables_,
                   "$deprecation$$value_enum_type_pass_through_nullness$ "
                   "${$get$capitalized_name$OrDefault$}$(\n"
                   "    $key_type$ key,\n"
                   "    $value_enum_type_pass_through_nullness$ "
                   "        defaultValue);\n");
    printer->Annotate("{", "}", descriptor_);
    WriteFieldDocComment(printer, descriptor_, context_->options());
    printer->Print(
        variables_,
        "$deprecation$$value_enum_type$ ${$get$capitalized_name$OrThrow$}$(\n"
        "    $key_type$ key);\n");
    printer->Annotate("{", "}", descriptor_);
    if (SupportUnknownEnumValue(value)) {
      printer->Print(
          variables_,
          "/**\n"
          " * Use {@link #get$capitalized_name$ValueMap()} instead.\n"
          " */\n"
          "@java.lang.Deprecated\n"
          "java.util.Map<$type_parameters$>\n"
          "${$get$capitalized_name$Value$}$();\n");
      printer->Annotate("{", "}", descriptor_);
      WriteFieldDocComment(printer, descriptor_, context_->options());
      printer->Print(variables_,
                     "$deprecation$java.util.Map<$type_parameters$>\n"
                     "${$get$capitalized_name$ValueMap$}$();\n");
      printer->Annotate("{", "}", descriptor_);
      WriteFieldDocComment(printer, descriptor_, context_->options());
      printer->Print(variables_,
                     "$deprecation$\n"
                     "$value_type_pass_through_nullness$ "
                     "${$get$capitalized_name$ValueOrDefault$}$(\n"
                     "    $key_type$ key,\n"
                     "    $value_type_pass_through_nullness$ defaultValue);\n");
      printer->Annotate("{", "}", descriptor_);
      WriteFieldDocComment(printer, descriptor_, context_->options());
      printer->Print(variables_,
                     "$deprecation$\n"
                     "$value_type$ ${$get$capitalized_name$ValueOrThrow$}$(\n"
                     "    $key_type$ key);\n");
      printer->Annotate("{", "}", descriptor_);
    }
  } else {
    if (context_->options().opensource_runtime) {
      printer->Print(variables_,
                     "/**\n"
                     " * Use {@link #get$capitalized_name$Map()} instead.\n"
                     " */\n"
                     "@java.lang.Deprecated\n"
                     "java.util.Map<$type_parameters$>\n"
                     "${$get$capitalized_name$$}$();\n");
      printer->Annotate("{", "}", descriptor_);
    }
    WriteFieldDocComment(printer, descriptor_, context_->options());
    printer->Print(variables_,
                   "$deprecation$java.util.Map<$type_parameters$>\n"
                   "${$get$capitalized_name$Map$}$();\n");
    printer->Annotate("{", "}", descriptor_);
    WriteFieldDocComment(printer, descriptor_, context_->options());
    printer->Print(variables_,
                   "$deprecation$\n"
                   "$value_type_pass_through_nullness$ "
                   "${$get$capitalized_name$OrDefault$}$(\n"
                   "    $key_type$ key,\n"
                   "    $value_type_pass_through_nullness$ defaultValue);\n");
    printer->Annotate("{", "}", descriptor_);
    WriteFieldDocComment(printer, descriptor_, context_->options());
    printer->Print(variables_,
                   "$deprecation$\n"
                   "$value_type$ ${$get$capitalized_name$OrThrow$}$(\n"
                   "    $key_type$ key);\n");
    printer->Annotate("{", "}", descriptor_);
  }
}